

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  string *__return_storage_ptr__;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var1;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var2;
  GeneratorFactory *pGVar3;
  ClassNameResolver *this_00;
  int iVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  FileDescriptor *pFVar7;
  int i;
  long lVar8;
  _Self __tmp;
  FileDescriptorProto local_1d8 [8];
  FileDescriptorProto file_proto;
  undefined1 local_100 [8];
  SharedCodeGenerator shared_code_generator;
  string dependency;
  FieldDescriptorSet extensions;
  string file_data;
  int method_num;
  int bytecode_estimate;
  undefined4 extraout_var;
  
  io::Printer::Print<char[6],char[1]>
            (printer,
             "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
             ,(char (*) [6])0x291d91,(char (*) [1])0x285505);
  google::protobuf::io::Printer::Indent();
  SharedCodeGenerator::SharedCodeGenerator
            ((SharedCodeGenerator *)local_100,this->file_,&this->options_);
  SharedCodeGenerator::GenerateDescriptors((SharedCodeGenerator *)local_100,printer);
  file_data.field_2._12_4_ = 0;
  file_data.field_2._8_4_ = 0;
  lVar8 = 0;
  while( true ) {
    pFVar7 = this->file_;
    if (*(int *)(pFVar7 + 0x2c) <= lVar8) break;
    _Var1._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    iVar4 = (**(code **)(*(long *)_Var1._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                  ._M_head_impl + 0x18))
                      (_Var1._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                       .
                       super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                       ._M_head_impl,printer);
    file_data.field_2._12_4_ = file_data.field_2._12_4_ + iVar4;
    anon_unknown_0::MaybeRestartJavaMethod
              (printer,(int *)(file_data.field_2._M_local_buf + 0xc),
               (int *)(file_data.field_2._M_local_buf + 8),
               "_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
    lVar8 = lVar8 + 1;
  }
  for (lVar8 = 0; lVar8 < *(int *)(pFVar7 + 0x38); lVar8 = lVar8 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                                  ._M_head_impl + 0x18))
                      (_Var2._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                       .
                       super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                       ._M_head_impl,printer);
    file_data.field_2._12_4_ = file_data.field_2._12_4_ + iVar4;
    anon_unknown_0::MaybeRestartJavaMethod
              (printer,(int *)(file_data.field_2._M_local_buf + 0xc),
               (int *)(file_data.field_2._M_local_buf + 8),
               "_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
    pFVar7 = this->file_;
  }
  FileDescriptorProto::FileDescriptorProto(local_1d8);
  google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)this->file_);
  extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&file_data._M_string_length;
  file_data._M_dataplus._M_p = (pointer)0x0;
  file_data._M_string_length._0_1_ = 0;
  google::protobuf::MessageLite::SerializeToString((string *)local_1d8);
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&extensions;
  extensions._M_t._M_impl._0_4_ = 0;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::CollectExtensions
            (local_1d8,*(DescriptorPool **)(this->file_ + 0x10),
             (FieldDescriptorSet *)((long)&dependency.field_2 + 8),
             (string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    io::Printer::Print<>
              (printer,
               "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
              );
    for (p_Var6 = extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 != (_Rb_tree_node_base *)&extensions;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pGVar3 = (this->generator_factory_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
               _M_head_impl;
      iVar4 = (*pGVar3->_vptr_GeneratorFactory[3])(pGVar3,*(undefined8 *)(p_Var6 + 1));
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      iVar4 = (**(code **)(*plVar5 + 0x20))(plVar5,printer);
      file_data.field_2._12_4_ = file_data.field_2._12_4_ + iVar4;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,(int *)(file_data.field_2._M_local_buf + 0xc),
                 (int *)(file_data.field_2._M_local_buf + 8),
                 "_clinit_autosplit_dinit_$method_num$(registry);\n",
                 "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                );
      (**(code **)(*plVar5 + 8))(plVar5);
    }
    io::Printer::Print<>
              (printer,
               "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
              );
  }
  __return_storage_ptr__ =
       (string *)(shared_code_generator.options_.output_list_file.field_2._M_local_buf + 8);
  for (iVar4 = 0; iVar4 < *(int *)(this->file_ + 0x20); iVar4 = iVar4 + 1) {
    google::protobuf::FileDescriptor::dependency((int)this->file_);
    this_00 = this->name_resolver_;
    pFVar7 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)this->file_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (__return_storage_ptr__,this_00,pFVar7);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"$dependency$.getDescriptor();\n",(char (*) [11])"dependency",
               __return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n");
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~set((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)((long)&dependency.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(local_1d8);
  SharedCodeGenerator::~SharedCodeGenerator((SharedCodeGenerator *)local_100);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Descriptors.FileDescriptor\n"
      "    getDescriptor() {\n"
      "  return descriptor;\n"
      "}\n"
      "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
      "    descriptor;\n"
      "static {\n",
      // TODO(dweis): Mark this as final.
      "final", "");
  printer->Indent();

  SharedCodeGenerator shared_code_generator(file_, options_);
  shared_code_generator.GenerateDescriptors(printer);

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate +=
        message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate +=
        extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  std::string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
        "com.google.protobuf.ExtensionRegistry registry =\n"
        "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (it = extensions.begin(); it != extensions.end(); it++) {
      std::unique_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(*it));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_dinit_$method_num$(registry);\n",
          "private static void _clinit_autosplit_dinit_$method_num$(\n"
          "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
        "com.google.protobuf.Descriptors.FileDescriptor\n"
        "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      std::string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print("$dependency$.getDescriptor();\n", "dependency",
                     dependency);
    }
  }

  printer->Outdent();
  printer->Print("}\n");
}